

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

bool __thiscall QPainterPath::intersects(QPainterPath *this,QRectF *rect)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  QPainterPathPrivate *pQVar5;
  qsizetype qVar6;
  const_reference pEVar7;
  Element *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  Element *e;
  int i;
  QPainterPathPrivate *d;
  QRectF rn;
  QRectF cp;
  qsizetype in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  QRectF *in_stack_fffffffffffffeb8;
  Element *pEVar8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined7 in_stack_fffffffffffffef8;
  byte bVar9;
  int local_f4;
  bool local_d1;
  qreal local_b0;
  qreal local_a8;
  QRectF *in_stack_ffffffffffffff60;
  QPainterPath *in_stack_ffffffffffffff68;
  qreal local_90;
  qreal local_88;
  qreal local_80;
  qreal local_78;
  QRectF local_70;
  QRectF local_50;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = elementCount((QPainterPath *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0)
                      );
  bVar9 = 0;
  if (iVar3 == 1) {
    elementAt((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
              (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_18 = Element::operator_cast_to_QPointF((Element *)in_stack_fffffffffffffeb8);
    bVar9 = QRectF::contains((QPointF *)in_RSI);
  }
  if ((bVar9 & 1) == 0) {
    bVar2 = isEmpty((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    if (bVar2) {
      local_d1 = false;
    }
    else {
      local_50.xp = -NAN;
      local_50.yp = -NAN;
      local_50.w = -NAN;
      local_50.h = -NAN;
      controlPointRect((QPainterPath *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0)
                      );
      local_70.xp = -NAN;
      local_70.yp = -NAN;
      local_70.w = -NAN;
      local_70.h = -NAN;
      QRectF::normalized();
      local_78 = QRectF::left(&local_70);
      local_80 = QRectF::left(&local_50);
      pdVar4 = qMax<double>(&local_78,&local_80);
      dVar1 = *pdVar4;
      local_88 = QRectF::right(&local_70);
      local_90 = QRectF::right(&local_50);
      pdVar4 = qMin<double>(&local_88,&local_90);
      bVar2 = true;
      if (dVar1 < *pdVar4 || dVar1 == *pdVar4) {
        in_stack_ffffffffffffff68 = (QPainterPath *)QRectF::top(&local_70);
        in_stack_ffffffffffffff60 = (QRectF *)QRectF::top(&local_50);
        pdVar4 = qMax<double>((double *)&stack0xffffffffffffff68,(double *)&stack0xffffffffffffff60)
        ;
        dVar1 = *pdVar4;
        local_a8 = QRectF::bottom(&local_70);
        local_b0 = QRectF::bottom(&local_50);
        pdVar4 = qMin<double>(&local_a8,&local_b0);
        bVar2 = *pdVar4 <= dVar1 && dVar1 != *pdVar4;
      }
      if (bVar2) {
        local_d1 = false;
      }
      else {
        bVar2 = qt_painterpath_check_crossing(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        if (bVar2) {
          local_d1 = true;
        }
        else {
          QRectF::center(in_stack_fffffffffffffeb8);
          bVar2 = contains((QPainterPath *)CONCAT17(bVar9,in_stack_fffffffffffffef8),in_RDI);
          if (bVar2) {
            local_d1 = true;
          }
          else {
            pQVar5 = d_func((QPainterPath *)0x5bb04b);
            local_f4 = 0;
            while( true ) {
              qVar6 = QList<QPainterPath::Element>::size(&pQVar5->elements);
              if (qVar6 <= local_f4) break;
              pEVar7 = QList<QPainterPath::Element>::at
                                 ((QList<QPainterPath::Element> *)
                                  CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                                  in_stack_fffffffffffffea8);
              bVar9 = 0;
              if (pEVar7->type == MoveToElement) {
                pEVar8 = in_RSI;
                Element::operator_cast_to_QPointF(in_RSI);
                bVar9 = QRectF::contains((QPointF *)pEVar8);
              }
              if ((bVar9 & 1) != 0) {
                local_d1 = true;
                goto LAB_005bb123;
              }
              local_f4 = local_f4 + 1;
            }
            local_d1 = false;
          }
        }
      }
    }
  }
  else {
    local_d1 = true;
  }
LAB_005bb123:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d1;
  }
  __stack_chk_fail();
}

Assistant:

bool QPainterPath::intersects(const QRectF &rect) const
{
    if (elementCount() == 1 && rect.contains(elementAt(0)))
        return true;

    if (isEmpty())
        return false;

    QRectF cp = controlPointRect();
    QRectF rn = rect.normalized();

    // QRectF::intersects returns false if one of the rects is a null rect
    // which would happen for a painter path consisting of a vertical or
    // horizontal line
    if (qMax(rn.left(), cp.left()) > qMin(rn.right(), cp.right())
        || qMax(rn.top(), cp.top()) > qMin(rn.bottom(), cp.bottom()))
        return false;

    // If any path element cross the rect its bound to be an intersection
    if (qt_painterpath_check_crossing(this, rect))
        return true;

    if (contains(rect.center()))
        return true;

    Q_D(QPainterPath);

    // Check if the rectangle surrounds any subpath...
    for (int i=0; i<d->elements.size(); ++i) {
        const Element &e = d->elements.at(i);
        if (e.type == QPainterPath::MoveToElement && rect.contains(e))
            return true;
    }

    return false;
}